

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

bool __thiscall
qclab::dense::SquareMatrix<double>::operator==
          (SquareMatrix<double> *this,SquareMatrix<double> *other)

{
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  long local_30;
  size_type_conflict i;
  size_type_conflict j;
  SquareMatrix<double> *other_local;
  SquareMatrix<double> *this_local;
  
  iVar2 = size(other);
  if (iVar2 == this->size_) {
    for (i = 0; i < this->size_; i = i + 1) {
      for (local_30 = 0; local_30 < this->size_; local_30 = local_30 + 1) {
        pdVar3 = operator()(other,local_30,i);
        dVar1 = *pdVar3;
        pdVar3 = operator()(this,local_30,i);
        if ((dVar1 != *pdVar3) || (NAN(dVar1) || NAN(*pdVar3))) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator==( const SquareMatrix< T >& other ) const {
          if ( other.size() != size_ ) return false ;
          for ( size_type j = 0; j < size_; j++ ) {
            for ( size_type i = 0; i < size_; i++ ) {
              if ( other(i,j) != (*this)(i,j) ) return false ;
            }
          }
          return true ;
        }